

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

TValue * stkindex2adr(lua_State *L,int idx)

{
  TValue *local_28;
  TValue *o;
  int idx_local;
  lua_State *L_local;
  TValue *local_8;
  
  if (idx < 1) {
    local_8 = L->top + idx;
  }
  else {
    local_28 = L->base + (idx + -1);
    if (L->top <= local_28) {
      local_28 = (TValue *)((ulong)(L->glref).ptr32 + 0x68);
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

static TValue *stkindex2adr(lua_State *L, int idx)
{
  if (idx > 0) {
    TValue *o = L->base + (idx - 1);
    return o < L->top ? o : niltv(L);
  } else {
    api_check(L, idx != 0 && -idx <= L->top - L->base);
    return L->top + idx;
  }
}